

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

bool __thiscall
qpdf::Stream::filterable
          (Stream *this,
          vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
          *filters,bool *specialized_compression,bool *lossy_compression)

{
  undefined8 uVar1;
  pointer pbVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  Members *pMVar7;
  size_type sVar8;
  iterator iVar9;
  pointer psVar10;
  __shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var12;
  pointer psVar13;
  uint i;
  uint uVar14;
  int iVar15;
  pointer __x;
  ulong __n;
  value_type filter;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> decode_parms;
  QPDFObjectHandle decode_obj;
  QPDFObjectHandle filter_obj;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filter_names;
  value_type decode_item;
  undefined1 local_f0 [32];
  vector<std::shared_ptr<QPDFStreamFilter>,std::allocator<std::shared_ptr<QPDFStreamFilter>>>
  *local_d0;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_c8;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a8;
  QPDFObjectHandle local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  Stream *local_70;
  bool *local_68;
  string *local_60;
  bool *local_58;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_d0 = (vector<std::shared_ptr<QPDFStreamFilter>,std::allocator<std::shared_ptr<QPDFStreamFilter>>>
              *)filters;
  local_70 = this;
  local_68 = specialized_compression;
  local_58 = lossy_compression;
  pMVar7 = stream(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f0,"/Filter",(allocator<char> *)&local_88);
  local_60 = (string *)&pMVar7->stream_dict;
  QPDFObjectHandle::getKey(&local_98,local_60);
  std::__cxx11::string::~string((string *)local_f0);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (key_type *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (key_type *)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar3 = QPDFObjectHandle::isNull(&local_98);
  if (bVar3) {
LAB_001c676d:
    pbVar2 = local_88.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = true;
    for (__x = local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __x != pbVar2; __x = __x + 1) {
      sVar8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count(&filter_abbreviations_abi_cxx11_,__x);
      if (sVar8 != 0) {
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator[](&filter_abbreviations_abi_cxx11_,__x);
        std::__cxx11::string::_M_assign((string *)__x);
      }
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFStreamFilter>_()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFStreamFilter>_()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<std::shared_ptr<QPDFStreamFilter>_()>_>_>_>
              ::find(&filter_factories_abi_cxx11_._M_t,__x);
      if ((_Rb_tree_header *)iVar9._M_node ==
          &filter_factories_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        bVar3 = false;
      }
      else {
        std::function<std::shared_ptr<QPDFStreamFilter>_()>::operator()
                  ((function<std::shared_ptr<QPDFStreamFilter>_()> *)local_f0);
        std::
        vector<std::shared_ptr<QPDFStreamFilter>,std::allocator<std::shared_ptr<QPDFStreamFilter>>>
        ::emplace_back<std::shared_ptr<QPDFStreamFilter>>
                  (local_d0,(shared_ptr<QPDFStreamFilter> *)local_f0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
      }
    }
    if (bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_f0,"/DecodeParms",(allocator<char> *)&local_c8);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_a8,local_60);
      std::__cxx11::string::~string((string *)local_f0);
      local_c8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&local_a8);
      if (bVar4) {
        iVar6 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)&local_a8);
        if (iVar6 == 0) {
          QPDFObjectHandle::newNull();
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_a8,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_f0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
        }
      }
      bVar4 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&local_a8);
      uVar14 = 0;
      if (bVar4) {
        while( true ) {
          iVar6 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)&local_a8);
          if (iVar6 <= (int)uVar14) break;
          QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_f0,(int)&local_a8);
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
          emplace_back<QPDFObjectHandle>(&local_c8,(QPDFObjectHandle *)local_f0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
          uVar14 = uVar14 + 1;
        }
      }
      else {
        for (; (ulong)uVar14 <
               (ulong)((long)local_88.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_88.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5); uVar14 = uVar14 + 1) {
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
                    (&local_c8,(value_type *)&local_a8);
        }
      }
      psVar13 = *(pointer *)local_d0;
      psVar10 = *(pointer *)(local_d0 + 8);
      if ((psVar10 == psVar13) ||
         ((long)local_c8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_c8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
                _M_impl.super__Vector_impl_data._M_start == (long)psVar10 - (long)psVar13)) {
        for (__n = 0; __n < (ulong)((long)psVar10 - (long)psVar13 >> 4); __n = __n + 1) {
          p_Var11 = &std::
                     vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                     ::at((vector<std::shared_ptr<QPDFStreamFilter>,_std::allocator<std::shared_ptr<QPDFStreamFilter>_>_>
                           *)local_d0,__n)->
                     super___shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<QPDFStreamFilter,_(__gnu_cxx::_Lock_policy)2> *)local_f0,p_Var11)
          ;
          p_Var12 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                              (&local_c8,__n);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_50,p_Var12)
          ;
          uVar1 = local_f0._0_8_;
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_40,&local_50);
          cVar5 = (**(code **)(*(long *)uVar1 + 0x10))(uVar1,&local_40);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
          if (cVar5 == '\0') {
            bVar3 = false;
          }
          else {
            cVar5 = (**(code **)(*(long *)local_f0._0_8_ + 0x20))();
            if (cVar5 != '\0') {
              *local_68 = true;
            }
            cVar5 = (**(code **)(*(long *)local_f0._0_8_ + 0x28))();
            if (cVar5 != '\0') {
              *local_68 = true;
              *local_58 = true;
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_f0 + 8));
          psVar13 = *(pointer *)local_d0;
          psVar10 = *(pointer *)(local_d0 + 8);
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_f0,"stream /DecodeParms length is inconsistent with filters",
                   (allocator<char> *)&local_50);
        warn(local_70,(string *)local_f0);
        std::__cxx11::string::~string((string *)local_f0);
        bVar3 = false;
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      goto LAB_001c6b6d;
    }
  }
  else {
    bVar3 = QPDFObjectHandle::isName(&local_98);
    if (bVar3) {
      QPDFObjectHandle::getName_abi_cxx11_((string *)local_f0,&local_98);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      std::__cxx11::string::~string((string *)local_f0);
      goto LAB_001c676d;
    }
    bVar3 = QPDFObjectHandle::isArray(&local_98);
    if (bVar3) {
      iVar6 = QPDFObjectHandle::getArrayNItems(&local_98);
      iVar15 = 0;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      bVar3 = true;
      for (; iVar6 != iVar15; iVar15 = iVar15 + 1) {
        QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&local_c8,(int)&local_98);
        bVar4 = QPDFObjectHandle::isName((QPDFObjectHandle *)&local_c8);
        if (bVar4) {
          QPDFObjectHandle::getName_abi_cxx11_((string *)local_f0,(QPDFObjectHandle *)&local_c8);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                     (string *)local_f0);
          std::__cxx11::string::~string((string *)local_f0);
        }
        else {
          bVar3 = false;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_c8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (bVar3) goto LAB_001c676d;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,"stream filter type is not name or array",
               (allocator<char> *)&local_c8);
    warn(local_70,(string *)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
  }
  bVar3 = false;
LAB_001c6b6d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar3;
}

Assistant:

bool
Stream::filterable(
    std::vector<std::shared_ptr<QPDFStreamFilter>>& filters,
    bool& specialized_compression,
    bool& lossy_compression)
{
    auto s = stream();
    // Check filters

    QPDFObjectHandle filter_obj = s->stream_dict.getKey("/Filter");
    bool filters_okay = true;

    std::vector<std::string> filter_names;

    if (filter_obj.isNull()) {
        // No filters
    } else if (filter_obj.isName()) {
        // One filter
        filter_names.push_back(filter_obj.getName());
    } else if (filter_obj.isArray()) {
        // Potentially multiple filters
        int n = filter_obj.getArrayNItems();
        for (int i = 0; i < n; ++i) {
            QPDFObjectHandle item = filter_obj.getArrayItem(i);
            if (item.isName()) {
                filter_names.push_back(item.getName());
            } else {
                filters_okay = false;
            }
        }
    } else {
        filters_okay = false;
    }

    if (!filters_okay) {
        QTC::TC("qpdf", "QPDF_Stream invalid filter");
        warn("stream filter type is not name or array");
        return false;
    }

    bool filterable = true;

    for (auto& filter_name: filter_names) {
        if (filter_abbreviations.count(filter_name)) {
            QTC::TC("qpdf", "QPDF_Stream expand filter abbreviation");
            filter_name = filter_abbreviations[filter_name];
        }

        auto ff = filter_factories.find(filter_name);
        if (ff == filter_factories.end()) {
            filterable = false;
        } else {
            filters.push_back((ff->second)());
        }
    }

    if (!filterable) {
        return false;
    }

    // filters now contains a list of filters to be applied in order. See which ones we can support.

    // See if we can support any decode parameters that are specified.

    QPDFObjectHandle decode_obj = s->stream_dict.getKey("/DecodeParms");
    std::vector<QPDFObjectHandle> decode_parms;
    if (decode_obj.isArray() && (decode_obj.getArrayNItems() == 0)) {
        decode_obj = QPDFObjectHandle::newNull();
    }
    if (decode_obj.isArray()) {
        for (int i = 0; i < decode_obj.getArrayNItems(); ++i) {
            decode_parms.push_back(decode_obj.getArrayItem(i));
        }
    } else {
        for (unsigned int i = 0; i < filter_names.size(); ++i) {
            decode_parms.push_back(decode_obj);
        }
    }

    // Ignore /DecodeParms entirely if /Filters is empty.  At least one case of a file whose
    // /DecodeParms was [ << >> ] when /Filters was empty has been seen in the wild.
    if ((filters.size() != 0) && (decode_parms.size() != filters.size())) {
        warn("stream /DecodeParms length is inconsistent with filters");
        filterable = false;
    }

    if (!filterable) {
        return false;
    }

    for (size_t i = 0; i < filters.size(); ++i) {
        auto filter = filters.at(i);
        auto decode_item = decode_parms.at(i);

        if (filter->setDecodeParms(decode_item)) {
            if (filter->isSpecializedCompression()) {
                specialized_compression = true;
            }
            if (filter->isLossyCompression()) {
                specialized_compression = true;
                lossy_compression = true;
            }
        } else {
            filterable = false;
        }
    }

    return filterable;
}